

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngrams_raw.c
# Opt level: O0

void ngrams_raw_free(ngram_raw_t **raw_ngrams,uint32 *counts,int order)

{
  int local_24;
  uint local_20;
  int order_it;
  uint32 num;
  int order_local;
  uint32 *counts_local;
  ngram_raw_t **raw_ngrams_local;
  
  for (local_24 = 0; local_24 < order + -1; local_24 = local_24 + 1) {
    for (local_20 = 0; local_20 < counts[local_24 + 1]; local_20 = local_20 + 1) {
      ckd_free(raw_ngrams[local_24][local_20].words);
    }
    ckd_free(raw_ngrams[local_24]);
  }
  ckd_free(raw_ngrams);
  return;
}

Assistant:

void
ngrams_raw_free(ngram_raw_t ** raw_ngrams, uint32 * counts, int order)
{
    uint32 num;
    int order_it;

    for (order_it = 0; order_it < order - 1; order_it++) {
        for (num = 0; num < counts[order_it + 1]; num++) {
            ckd_free(raw_ngrams[order_it][num].words);
        }
        ckd_free(raw_ngrams[order_it]);
    }
    ckd_free(raw_ngrams);
}